

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void delete_insn_data(MIR_insn_t insn)

{
  void *__ptr;
  int iVar1;
  insn_data_t insn_data;
  MIR_insn_t insn_local;
  
  __ptr = insn->data;
  if ((__ptr != (void *)0x0) && (iVar1 = insn_data_p(insn), iVar1 != 0)) {
    iVar1 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
    if ((iVar1 != 0) && (*(long *)((long)__ptr + 8) != 0)) {
      bitmap_destroy(*(bitmap_t *)((long)__ptr + 8));
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void delete_insn_data (MIR_insn_t insn) {
  insn_data_t insn_data = insn->data;

  if (insn_data == NULL || !insn_data_p (insn)) return;
  if (MIR_call_code_p (insn->code) && insn_data->u.call_hard_reg_args != NULL)
    bitmap_destroy (insn_data->u.call_hard_reg_args);
  free (insn_data);
}